

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedLinearAllocator.hpp
# Opt level: O0

ShaderVariableManagerGL * __thiscall
Diligent::FixedLinearAllocator::
ConstructArray<Diligent::ShaderVariableManagerGL,std::reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>>,std::reference_wrapper<Diligent::ShaderResourceCacheGL>>
          (FixedLinearAllocator *this,size_t count,
          reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>_>
          *args,reference_wrapper<Diligent::ShaderResourceCacheGL> *args_1)

{
  ShaderVariableManagerGL *pSVar1;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *Owner;
  ShaderResourceCacheGL *ResourceCache;
  ulong local_38;
  size_t i;
  ShaderVariableManagerGL *Ptr;
  reference_wrapper<Diligent::ShaderResourceCacheGL> *args_local_1;
  reference_wrapper<Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>_> *args_local;
  size_t count_local;
  FixedLinearAllocator *this_local;
  
  pSVar1 = Allocate<Diligent::ShaderVariableManagerGL>(this,count);
  for (local_38 = 0; local_38 < count; local_38 = local_38 + 1) {
    Owner = std::reference_wrapper::operator_cast_to_ShaderResourceBindingBase_
                      ((reference_wrapper *)args);
    ResourceCache =
         std::reference_wrapper::operator_cast_to_ShaderResourceCacheGL_
                   ((reference_wrapper *)args_1);
    ShaderVariableManagerGL::ShaderVariableManagerGL
              (pSVar1 + local_38,(IObject *)Owner,ResourceCache);
  }
  return pSVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }